

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

StringPtr __thiscall capnp::compiler::CompilerMain::toString(CompilerMain *this,Format format)

{
  Format format_local;
  CompilerMain *this_local;
  
  switch(format) {
  case BINARY:
    kj::StringPtr::StringPtr((StringPtr *)&this_local,"binary");
    break;
  case PACKED:
    kj::StringPtr::StringPtr((StringPtr *)&this_local,"packed");
    break;
  case FLAT:
    kj::StringPtr::StringPtr((StringPtr *)&this_local,"flat");
    break;
  case FLAT_PACKED:
    kj::StringPtr::StringPtr((StringPtr *)&this_local,"flat-packed");
    break;
  case CANONICAL:
    kj::StringPtr::StringPtr((StringPtr *)&this_local,"canonical");
    break;
  case TEXT:
    kj::StringPtr::StringPtr((StringPtr *)&this_local,"text");
    break;
  case JSON:
    kj::StringPtr::StringPtr((StringPtr *)&this_local,"json");
    break;
  default:
    kj::_::unreachable();
  }
  return (StringPtr)_this_local;
}

Assistant:

kj::StringPtr toString(Format format) {
    switch (format) {
      case Format::BINARY     : return "binary";
      case Format::PACKED     : return "packed";
      case Format::FLAT       : return "flat";
      case Format::FLAT_PACKED: return "flat-packed";
      case Format::CANONICAL  : return "canonical";
      case Format::TEXT       : return "text";
      case Format::JSON       : return "json";
    }
    KJ_UNREACHABLE;
  }